

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lazy_dependencies.pb.cc
# Opt level: O0

void proto2_unittest::lazy_imports::ImportedMessage::SharedDtor(MessageLite *self)

{
  LazyMessage *this;
  Arena *pAVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  ImportedMessage *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (ImportedMessage *)self;
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  pAVar1 = google::protobuf::MessageLite::GetArena(local_18);
  if (pAVar1 == (Arena *)0x0) {
    this = (LazyMessage *)local_18[1]._internal_metadata_.ptr_;
    if (this != (LazyMessage *)0x0) {
      LazyMessage::~LazyMessage(this);
      operator_delete(this,0x20);
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lazy_dependencies.pb.cc"
             ,0xdd,"this_.GetArena() == nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void ImportedMessage::SharedDtor(MessageLite& self) {
  ImportedMessage& this_ = static_cast<ImportedMessage&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.lazy_message_;
  this_._impl_.~Impl_();
}